

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::remove_peer(torrent *this,shared_ptr<libtorrent::aux::peer_connection> *p)

{
  element_type *peVar1;
  peer_list *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator __position;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bitmask;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_f8;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  weak_ptr<libtorrent::aux::torrent> weak_t;
  _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  local_40;
  torrent_peer *peer;
  
  peVar1 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*(peVar1->super_peer_connection_interface)._vptr_peer_connection_interface[6])
            (&weak_t,&peVar1->super_peer_connection_interface);
  __position = ::std::
               _Rb_tree<libtorrent::digest32<160L>,_libtorrent::digest32<160L>,_std::_Identity<libtorrent::digest32<160L>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
               ::find(&(this->m_outgoing_pids)._M_t,(key_type *)&weak_t);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    _Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_outgoing_pids,(const_iterator)__position._M_node);
  }
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_f8,
             &(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&weak_t,&local_f8
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_f8._M_refcount);
  if (weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this)
  {
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::torrent,void>
              ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&weak_t,
               (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_f8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_refcount);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::push_back(&this->m_peers_to_disconnect,p);
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [7])();
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    local_f8._M_ptr = local_e8;
    local_f8._M_refcount._M_pi = _Stack_e0._M_pi;
    local_e8 = (element_type *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    deferred_handler::
    post_deferred<libtorrent::aux::handler<libtorrent::aux::torrent,void(libtorrent::aux::torrent::*)()noexcept,&libtorrent::aux::torrent::on_remove_peers,&libtorrent::aux::torrent::on_error,&libtorrent::aux::torrent::on_exception,libtorrent::aux::handler_storage<80ul,(libtorrent::aux::HandlerName)5>,&libtorrent::aux::torrent::m_deferred_handler_storage>>
              (&this->m_deferred_disconnect,(io_context *)CONCAT44(extraout_var,iVar3),
               (handler<libtorrent::aux::torrent,_void_(libtorrent::aux::torrent::*)()_noexcept,_&libtorrent::aux::torrent::on_remove_peers,_&libtorrent::aux::torrent::on_error,_&libtorrent::aux::torrent::on_exception,_libtorrent::aux::handler_storage<80UL,_(libtorrent::aux::HandlerName)5>,_&libtorrent::aux::torrent::m_deferred_handler_storage>
                *)&local_f8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    remove_connection(this,(p->
                           super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
  }
  iVar3 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  peer = (torrent_peer *)CONCAT44(extraout_var_00,iVar3);
  if ((((this->super_torrent_hot_members).field_0x4b & 2) != 0) &&
     ((this->super_torrent_hot_members).m_picker._M_t.
      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
      (piece_picker *)0x0)) {
    bVar2 = peer_connection::is_seed
                      ((p->
                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    if (bVar2) {
      piece_picker::dec_refcount_all
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,peer);
    }
    else {
      bitmask = peer_connection::get_bitfield
                          ((p->
                           super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
      piece_picker::dec_refcount
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,bitmask
                 ,peer);
    }
  }
  iVar3 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
  if ((char)iVar3 == '\0') {
    bVar2 = peer_connection::ignore_unchoke_slots
                      ((p->
                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    if (!bVar2) {
      *(uint *)&this->field_0x5d8 =
           *(uint *)&this->field_0x5d8 & 0xff000000 | *(uint *)&this->field_0x5d8 - 1 & 0xffffff;
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x15]
      )();
    }
  }
  if (peer != (torrent_peer *)0x0) {
    if ((*(uint *)&peer->field_0x1b & 0x40) != 0) {
      *(uint *)&peer->field_0x1b = *(uint *)&peer->field_0x1b & 0xffffffbf;
      counters::inc_stats_counter(this->m_stats_counters,0xea,-1);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x14]
      )();
    }
    iVar3 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    peer->prev_amount_download =
         peer->prev_amount_download +
         (int)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x20) / 0x400);
    iVar3 = (*(((p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    peer->prev_amount_upload =
         peer->prev_amount_upload + (int)(*(long *)CONCAT44(extraout_var_02,iVar3) / 0x400);
    if ((weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         this) && ((peer->field_0x1b & 0x80) != 0)) {
      this->m_num_seeds = this->m_num_seeds - 1;
    }
    if ((peer->connection != (peer_connection_interface *)0x0) &&
       ((this->super_torrent_hot_members).m_peer_list._M_t.
        super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl != (peer_list *)0x0
       )) {
      get_peer_list_state((torrent_state *)&weak_t,this);
      this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
                super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
      peVar1 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      uVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0xf])();
      peer_list::connection_closed
                (this_00,&peVar1->super_peer_connection_interface,uVar4 & 0xffff,
                 (torrent_state *)&weak_t);
      peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         *)&local_40);
      ::std::
      _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ::~_Vector_base(&local_40);
    }
  }
  peVar1 = (p->super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*(peVar1->super_bandwidth_socket)._vptr_bandwidth_socket[6])(peVar1,0);
  update_want_peers(this);
  update_want_tick(this);
  return;
}

Assistant:

void torrent::remove_peer(std::shared_ptr<peer_connection> p) noexcept
	{
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(std::count(m_peers_to_disconnect.begin()
			, m_peers_to_disconnect.end(), p) == 0);

		auto it = m_outgoing_pids.find(p->our_pid());
		if (it != m_outgoing_pids.end())
		{
			m_outgoing_pids.erase(it);
		}

		// only schedule the peer for actual removal if in fact
		// we can be sure peer_connection will be kept alive until
		// the deferred function is called. If a peer_connection
		// has not associated torrent, the session_impl object may
		// remove it at any time, which may be while the non-owning
		// pointer in m_peers_to_disconnect (if added to it) is
		// waiting for the deferred function to be called.
		//
		// one example of this situation is if for example, this
		// function is called from the attach_peer path and fail to
		// do so because of too many connections.
		bool const is_attached = p->associated_torrent().lock().get() == this;
		if (is_attached)
		{
			std::weak_ptr<torrent> weak_t = shared_from_this();
			TORRENT_ASSERT_VAL(m_peers_to_disconnect.capacity() > m_peers_to_disconnect.size()
				, m_peers_to_disconnect.capacity());
			m_peers_to_disconnect.push_back(p);

			using deferred_handler_type = aux::handler<
				torrent
				, decltype(&torrent::on_remove_peers)
				, &torrent::on_remove_peers
				, &torrent::on_error
				, &torrent::on_exception
				, decltype(m_deferred_handler_storage)
				, &torrent::m_deferred_handler_storage
				>;
			static_assert(sizeof(deferred_handler_type) == sizeof(std::shared_ptr<peer_connection>)
				, "deferred handler does not have the expected size");
			m_deferred_disconnect.post_deferred(m_ses.get_context(), deferred_handler_type(shared_from_this()));
		}
		else
		{
			// if the peer was inserted in m_connections but instructed to
			// be removed from this torrent, just remove it from it, see
			// attach_peer logic.
			remove_connection(p.get());
		}

		torrent_peer* pp = p->peer_info_struct();
		if (ready_for_connections())
		{
			TORRENT_ASSERT(p->associated_torrent().lock().get() == nullptr
				|| p->associated_torrent().lock().get() == this);

			if (has_picker())
			{
				if (p->is_seed())
				{
					m_picker->dec_refcount_all(pp);
				}
				else
				{
					auto const& pieces = p->get_bitfield();
					TORRENT_ASSERT(pieces.count() <= pieces.size());
					m_picker->dec_refcount(pieces, pp);
				}
			}
		}

		if (!p->is_choked() && !p->ignore_unchoke_slots())
		{
			--m_num_uploads;
			trigger_unchoke();
		}

		if (pp)
		{
			if (pp->optimistically_unchoked)
			{
				pp->optimistically_unchoked = false;
				m_stats_counters.inc_stats_counter(
					counters::num_peers_up_unchoked_optimistic, -1);
				trigger_optimistic_unchoke();
			}

			TORRENT_ASSERT(pp->prev_amount_upload == 0);
			TORRENT_ASSERT(pp->prev_amount_download == 0);
			pp->prev_amount_download += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_download() / 1024);
			pp->prev_amount_upload += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_upload() / 1024);

			// only decrement the seed count if the peer completed attaching to the torrent
			// otherwise the seed count did not get incremented for this peer
			if (is_attached && pp->seed)
			{
				TORRENT_ASSERT(m_num_seeds > 0);
				--m_num_seeds;
			}

			if (pp->connection && m_peer_list)
			{
				torrent_state st = get_peer_list_state();
				m_peer_list->connection_closed(*p, m_ses.session_time(), &st);
				peers_erased(st.erased);
			}
		}

		p->set_peer_info(nullptr);

		update_want_peers();
		update_want_tick();
	}